

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

_Bool bitset_bitset_container_intersection_inplace
                (bitset_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  int size;
  array_container_t *paVar1;
  bitset_container_t *in_RDX;
  bitset_container_t *in_RSI;
  undefined8 in_RDI;
  int newCardinality;
  size_t unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var2;
  
  size = bitset_container_and_justcard(in_RSI,in_RDX);
  if (size < 0x1001) {
    paVar1 = array_container_create_given_capacity(size);
    *(array_container_t **)in_RDX = paVar1;
    if (*(long *)in_RDX != 0) {
      **(int **)in_RDX = size;
      bitset_extract_intersection_setbits_uint16
                ((uint64_t *)src_2,(uint64_t *)dst,unaff_retaddr,
                 (uint16_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 (uint16_t)((ulong)in_RDI >> 0x30));
    }
    _Var2 = false;
  }
  else {
    *(undefined8 *)in_RDX = in_RDI;
    bitset_container_and_nocard
              (in_RSI,in_RDX,(bitset_container_t *)CONCAT44(size,in_stack_ffffffffffffffd8));
    **(int **)in_RDX = size;
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool bitset_bitset_container_intersection_inplace(
    bitset_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst) {
    const int newCardinality = bitset_container_and_justcard(src_1, src_2);
    if (newCardinality > DEFAULT_MAX_SIZE) {
        *dst = src_1;
        bitset_container_and_nocard(src_1, src_2, src_1);
        CAST_bitset(*dst)->cardinality = newCardinality;
        return true;  // it is a bitset
    }
    *dst = array_container_create_given_capacity(newCardinality);
    if (*dst != NULL) {
        CAST_array(*dst)->cardinality = newCardinality;
        bitset_extract_intersection_setbits_uint16(
            src_1->words, src_2->words, BITSET_CONTAINER_SIZE_IN_WORDS,
            CAST_array(*dst)->array, 0);
    }
    return false;  // not a bitset
}